

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdSignSchnorr(void *handle,char *msg,char *sk,char *aux_rand,char **signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  SchnorrSignature schnorr_sig;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  SchnorrSignature local_130;
  SchnorrSignature local_108;
  string local_e0;
  string local_c0;
  Privkey local_a0;
  string local_80;
  ByteData256 local_60;
  ByteData256 local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (bVar1) {
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x26c;
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_130,kCfdLogLevelWarning,"msg is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_130.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Failed to parameter. msg is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_130);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(sk);
  if (bVar1) {
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x272;
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_130,kCfdLogLevelWarning,"sk is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_130.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Failed to parameter. sk is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_130);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (signature == (char **)0x0) {
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x278;
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignSchnorr";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_130,kCfdLogLevelWarning,"signature is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_130.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Failed to parameter. signature is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_130);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::SchnorrSignature::SchnorrSignature(&local_130);
  bVar1 = cfd::capi::IsEmptyString(aux_rand);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_80,msg,(allocator *)&local_48);
    cfd::core::ByteData256::ByteData256((ByteData256 *)&local_e0,&local_80);
    std::__cxx11::string::string((string *)&local_c0,sk,(allocator *)&local_60);
    cfd::core::Privkey::Privkey(&local_a0,&local_c0,kMainnet,true);
    cfd::core::SchnorrUtil::Sign(&local_108,(ByteData256 *)&local_e0,&local_a0);
    cfd::core::SchnorrSignature::operator=(&local_130,&local_108);
    if (local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e0._M_dataplus._M_p;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_80,msg,&local_131);
    cfd::core::ByteData256::ByteData256(&local_48,&local_80);
    std::__cxx11::string::string((string *)&local_c0,sk,&local_132);
    cfd::core::Privkey::Privkey(&local_a0,&local_c0,kMainnet,true);
    std::__cxx11::string::string((string *)&local_e0,aux_rand,&local_133);
    cfd::core::ByteData256::ByteData256(&local_60,&local_e0);
    cfd::core::SchnorrUtil::Sign(&local_108,&local_48,&local_a0,&local_60);
    cfd::core::SchnorrSignature::operator=(&local_130,&local_108);
    if (local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&local_108,&local_130,false);
  pcVar2 = cfd::capi::CreateString((string *)&local_108);
  *signature = pcVar2;
  if ((pointer *)
      local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer *)
      ((long)&local_108.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 0x10U)) {
    operator_delete(local_108.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_130.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdSignSchnorr(
    void* handle, const char* msg, const char* sk, const char* aux_rand,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    SchnorrSignature schnorr_sig;
    if (IsEmptyString(aux_rand)) {
      schnorr_sig = SchnorrUtil::Sign(ByteData256(msg), Privkey(sk));
    } else {
      schnorr_sig = SchnorrUtil::Sign(
          ByteData256(msg), Privkey(sk), ByteData256(aux_rand));
    }

    *signature = CreateString(schnorr_sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}